

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPUDPv6Transmitter::DeleteFromIgnoreList(RTPUDPv6Transmitter *this,RTPAddress *addr)

{
  uint16_t port;
  AddressType AVar1;
  in6_addr ip;
  RTPIPv6Address *address;
  int status;
  RTPAddress *addr_local;
  RTPUDPv6Transmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x72;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x71;
  }
  else {
    AVar1 = RTPAddress::GetAddressType(addr);
    if (AVar1 == IPv6Address) {
      if (this->receivemode == IgnoreSome) {
        ip = RTPIPv6Address::GetIP((RTPIPv6Address *)addr);
        port = RTPIPv6Address::GetPort((RTPIPv6Address *)addr);
        this_local._4_4_ = ProcessDeleteAcceptIgnoreEntry(this,ip,port);
      }
      else {
        this_local._4_4_ = -0x6a;
      }
    }
    else {
      this_local._4_4_ = -0x6c;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPUDPv6Transmitter::DeleteFromIgnoreList(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	int status;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv6Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_INVALIDADDRESSTYPE;
	}
	if (receivemode != RTPTransmitter::IgnoreSome)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_DIFFERENTRECEIVEMODE;
	}
	
	const RTPIPv6Address &address = (const RTPIPv6Address &)addr;	
	status = ProcessDeleteAcceptIgnoreEntry(address.GetIP(),address.GetPort());

	MAINMUTEX_UNLOCK
	return status;
}